

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O3

Error * ot::commissioner::CommissionerImpl::EncodeBbrDataset
                  (Error *__return_storage_ptr__,Request *aRequest,BbrDataset *aDataset)

{
  string *this;
  ushort uVar1;
  ErrorCode EVar2;
  Address addr;
  Tlv TStack_98;
  undefined1 local_78 [8];
  _Alloc_hider local_70;
  char local_60 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  Address local_48;
  
  __return_storage_ptr__->mCode = kNone;
  this = &__return_storage_ptr__->mMessage;
  local_50 = &(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p = (pointer)local_50;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  uVar1 = aDataset->mPresentFlags;
  if ((short)uVar1 < 0) {
    tlv::Tlv::Tlv(&TStack_98,kTriHostname,&aDataset->mTriHostname,kMeshCoP);
    AppendTlv((Error *)local_78,aRequest,&TStack_98);
    __return_storage_ptr__->mCode = local_78._0_4_;
    std::__cxx11::string::operator=((string *)this,(string *)&local_70);
    EVar2 = __return_storage_ptr__->mCode;
    if (local_70._M_p != local_60) {
      operator_delete(local_70._M_p);
    }
    if (TStack_98.mValue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(TStack_98.mValue.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (EVar2 != kNone) {
      return __return_storage_ptr__;
    }
    uVar1 = aDataset->mPresentFlags;
  }
  if ((uVar1 >> 0xe & 1) != 0) {
    tlv::Tlv::Tlv(&TStack_98,kRegistrarHostname,&aDataset->mRegistrarHostname,kMeshCoP);
    AppendTlv((Error *)local_78,aRequest,&TStack_98);
    __return_storage_ptr__->mCode = local_78._0_4_;
    std::__cxx11::string::operator=((string *)this,(string *)&local_70);
    EVar2 = __return_storage_ptr__->mCode;
    if (local_70._M_p != local_60) {
      operator_delete(local_70._M_p);
    }
    if (TStack_98.mValue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(TStack_98.mValue.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (EVar2 != kNone) {
      return __return_storage_ptr__;
    }
    uVar1 = aDataset->mPresentFlags;
  }
  if ((uVar1 >> 0xd & 1) != 0) {
    local_48.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    Address::Set((Error *)local_78,&local_48,&aDataset->mRegistrarIpv6Addr);
    __return_storage_ptr__->mCode = local_78._0_4_;
    std::__cxx11::string::operator=((string *)this,(string *)&local_70);
    EVar2 = __return_storage_ptr__->mCode;
    if (local_70._M_p != local_60) {
      operator_delete(local_70._M_p);
    }
    if (EVar2 == kNone) {
      tlv::Tlv::Tlv(&TStack_98,kRegistrarIpv6Address,&local_48.mBytes,kMeshCoP);
      AppendTlv((Error *)local_78,aRequest,&TStack_98);
      __return_storage_ptr__->mCode = local_78._0_4_;
      std::__cxx11::string::operator=((string *)this,(string *)&local_70);
      if (local_70._M_p != local_60) {
        operator_delete(local_70._M_p);
      }
      if (TStack_98.mValue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(TStack_98.mValue.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
    if (local_48.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.mBytes.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerImpl::EncodeBbrDataset(coap::Request &aRequest, const BbrDataset &aDataset)
{
    Error error;

    if (aDataset.mPresentFlags & BbrDataset::kTriHostnameBit)
    {
        SuccessOrExit(error = AppendTlv(aRequest, {tlv::Type::kTriHostname, aDataset.mTriHostname}));
    }

    if (aDataset.mPresentFlags & BbrDataset::kRegistrarHostnameBit)
    {
        SuccessOrExit(error = AppendTlv(aRequest, {tlv::Type::kRegistrarHostname, aDataset.mRegistrarHostname}));
    }

    if (aDataset.mPresentFlags & BbrDataset::kRegistrarIpv6AddrBit)
    {
        Address addr;

        SuccessOrExit(error = addr.Set(aDataset.mRegistrarIpv6Addr));
        SuccessOrExit(error = AppendTlv(aRequest, {tlv::Type::kRegistrarIpv6Address, addr.GetRaw()}));
    }

exit:
    return error;
}